

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t minThreshold,uint8_t maxThreshold,uint32_t simdWidth,
                   uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  undefined1 uVar7;
  undefined1 *puVar8;
  undefined8 *in_RCX;
  ulong *in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined8 *in_R8;
  byte in_R9B;
  undefined1 auVar9 [16];
  byte in_stack_00000008;
  char minCompareValue;
  simd notMask;
  uint in_stack_00000020;
  char notMaskValue;
  simd shiftMask;
  char shiftMaskValue;
  undefined1 *local_248;
  byte *local_240;
  undefined8 *local_218;
  ulong *local_210;
  undefined8 *local_188;
  ulong *local_180;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_a8;
  ulong uStack_a0;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd data;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd maxCompare;
  char maxCompareValue;
  simd minCompare;
  
  auVar3 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
  auVar3 = vpinsrb_avx(auVar3,0x80,2);
  auVar3 = vpinsrb_avx(auVar3,0x80,3);
  auVar3 = vpinsrb_avx(auVar3,0x80,4);
  auVar3 = vpinsrb_avx(auVar3,0x80,5);
  auVar3 = vpinsrb_avx(auVar3,0x80,6);
  auVar3 = vpinsrb_avx(auVar3,0x80,7);
  auVar3 = vpinsrb_avx(auVar3,0x80,8);
  auVar3 = vpinsrb_avx(auVar3,0x80,9);
  auVar3 = vpinsrb_avx(auVar3,0x80,10);
  auVar3 = vpinsrb_avx(auVar3,0x80,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x80,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x80,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x80,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x80,0xf);
  local_a8 = auVar3._0_8_;
  uStack_a0 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar3 = vpinsrb_avx(auVar3,0xff,2);
  auVar3 = vpinsrb_avx(auVar3,0xff,3);
  auVar3 = vpinsrb_avx(auVar3,0xff,4);
  auVar3 = vpinsrb_avx(auVar3,0xff,5);
  auVar3 = vpinsrb_avx(auVar3,0xff,6);
  auVar3 = vpinsrb_avx(auVar3,0xff,7);
  auVar3 = vpinsrb_avx(auVar3,0xff,8);
  auVar3 = vpinsrb_avx(auVar3,0xff,9);
  auVar3 = vpinsrb_avx(auVar3,0xff,10);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xb);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xc);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xd);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xe);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xf);
  bVar6 = in_R9B + 0x80;
  auVar4 = vpinsrb_avx(ZEXT116(bVar6),(uint)bVar6,1);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,2);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,3);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,4);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,5);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,6);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,7);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,8);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,9);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,10);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,0xb);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,0xc);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,0xd);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,0xe);
  auVar4 = vpinsrb_avx(auVar4,(uint)bVar6,0xf);
  bVar6 = in_stack_00000008 + 0x80;
  auVar5 = vpinsrb_avx(ZEXT116(bVar6),(uint)bVar6,1);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,2);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,3);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,4);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,5);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,6);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,7);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,8);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,9);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,10);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,0xb);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,0xc);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,0xd);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,0xe);
  auVar5 = vpinsrb_avx(auVar5,(uint)bVar6,0xf);
  local_180 = in_RDX;
  for (local_188 = in_RCX; local_188 != in_R8;
      local_188 = (undefined8 *)((long)local_188 + (ulong)in_ESI)) {
    local_218 = local_188;
    for (local_210 = local_180; local_210 != local_180 + (ulong)(uint)notMask[0] * 2;
        local_210 = local_210 + 2) {
      auVar9._8_8_ = local_210[1] ^ uStack_a0;
      auVar9._0_8_ = *local_210 ^ local_a8;
      auVar9 = vpcmpgtb_avx(auVar4,auVar9);
      auVar2._8_8_ = local_210[1] ^ uStack_a0;
      auVar2._0_8_ = *local_210 ^ local_a8;
      auVar2 = vpcmpgtb_avx(auVar2,auVar5);
      auVar9 = vpor_avx(auVar9,auVar2);
      auVar9 = vpternlogq_avx512vl(auVar9,auVar9,auVar9,0xf);
      auVar9 = vpand_avx(auVar9,auVar3);
      local_168 = auVar9._0_8_;
      uStack_160 = auVar9._8_8_;
      *local_218 = local_168;
      local_218[1] = uStack_160;
      local_218 = local_218 + 2;
    }
    if (in_stack_00000020 != 0) {
      local_240 = (byte *)((long)local_180 + (ulong)(uint)notMask[1]);
      local_248 = (undefined1 *)((long)local_188 + (ulong)(uint)notMask[1]);
      puVar8 = local_248 + in_stack_00000020;
      for (; local_248 != puVar8; local_248 = local_248 + 1) {
        bVar1 = true;
        if (in_R9B <= *local_240) {
          bVar1 = in_stack_00000008 < *local_240;
        }
        uVar7 = 0xff;
        if (bVar1) {
          uVar7 = 0;
        }
        *local_248 = uVar7;
        local_240 = local_240 + 1;
      }
    }
    local_180 = (ulong *)((long)local_180 + (ulong)in_EDI);
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t minThreshold, uint8_t maxThreshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char shiftMaskValue = static_cast<char>(0x80u);
        const simd shiftMask = _mm_set_epi8( shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
                                             shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue );

        const char notMaskValue = static_cast<char>(0xffu);
        const simd notMask = _mm_set_epi8( notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue,
                                           notMaskValue, notMaskValue, notMaskValue, notMaskValue );

        const char minCompareValue = static_cast<char>(minThreshold ^ 0x80u);
        const simd minCompare = _mm_set_epi8(
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue,
            minCompareValue, minCompareValue, minCompareValue, minCompareValue );

        const char maxCompareValue = static_cast<char>(maxThreshold ^ 0x80u);
        const simd maxCompare = _mm_set_epi8(
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst ) {
                simd data = _mm_xor_si128( _mm_loadu_si128( src1 ), shiftMask );

                _mm_storeu_si128( dst, _mm_andnot_si128(
                    _mm_or_si128(
                        _mm_cmplt_epi8( data, minCompare ),
                        _mm_cmpgt_epi8( data, maxCompare ) ),
                    notMask ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
            }
        }
    }